

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttinterp.c
# Opt level: O2

FT_Bool SkipCode(TT_ExecContext exc)

{
  byte bVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  
  lVar3 = (long)exc->length + exc->IP;
  exc->IP = lVar3;
  lVar2 = exc->codeSize;
  if (lVar3 < lVar2) {
    bVar1 = exc->code[lVar3];
    exc->opcode = bVar1;
    iVar4 = (int)opcode_length[bVar1];
    exc->length = iVar4;
    if ((bVar1 & 0xfe) == 0x40) {
      if (lVar2 <= lVar3 + 1) goto LAB_0016dead;
      iVar4 = 2 - (uint)exc->code[lVar3 + 1] * iVar4;
      exc->length = iVar4;
    }
    if (lVar3 + iVar4 <= lVar2) {
      return '\0';
    }
  }
LAB_0016dead:
  exc->error = 0x83;
  return '\x01';
}

Assistant:

static FT_Bool
  SkipCode( TT_ExecContext  exc )
  {
    exc->IP += exc->length;

    if ( exc->IP < exc->codeSize )
    {
      exc->opcode = exc->code[exc->IP];

      exc->length = opcode_length[exc->opcode];
      if ( exc->length < 0 )
      {
        if ( exc->IP + 1 >= exc->codeSize )
          goto Fail_Overflow;
        exc->length = 2 - exc->length * exc->code[exc->IP + 1];
      }

      if ( exc->IP + exc->length <= exc->codeSize )
        return SUCCESS;
    }

  Fail_Overflow:
    exc->error = FT_THROW( Code_Overflow );
    return FAILURE;
  }